

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::ParseBindVarOpt(WastParser *this,string *name)

{
  TokenType TVar1;
  Token token;
  allocator<char> local_91;
  string_view local_90;
  string local_80 [32];
  Token local_60;
  
  TVar1 = Peek(this,0);
  if (TVar1 == Last_String) {
    Consume(&local_60,this);
    local_90 = Token::text(&local_60);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_80,&local_90,&local_91);
    std::__cxx11::string::operator=((string *)name,local_80);
    std::__cxx11::string::_M_dispose();
  }
  return TVar1 == Last_String;
}

Assistant:

bool WastParser::ParseBindVarOpt(std::string* name) {
  WABT_TRACE(ParseBindVarOpt);
  if (!PeekMatch(TokenType::Var)) {
    return false;
  }
  Token token = Consume();
  *name = std::string(token.text());
  return true;
}